

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleInfoMap.h
# Opt level: O1

void __thiscall
cbtTriangleInfoMap::deSerialize(cbtTriangleInfoMap *this,cbtTriangleInfoMapData *tmapData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  cbtTriangleInfo *ptr;
  cbtTriangleInfoData *pcVar6;
  cbtHashInt *pcVar7;
  undefined8 uVar8;
  int *piVar9;
  long lVar10;
  cbtTriangleInfo *pcVar11;
  cbtScalar *pcVar12;
  cbtHashInt *pcVar13;
  long lVar14;
  
  this->m_convexEpsilon = tmapData->m_convexEpsilon;
  this->m_planarEpsilon = tmapData->m_planarEpsilon;
  this->m_equalVertexThreshold = tmapData->m_equalVertexThreshold;
  this->m_edgeDistanceThreshold = tmapData->m_edgeDistanceThreshold;
  this->m_zeroAreaThreshold = tmapData->m_zeroAreaThreshold;
  iVar3 = tmapData->m_hashTableSize;
  iVar4 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_size;
  if ((iVar4 <= iVar3) && (iVar4 < iVar3)) {
    if ((this->super_cbtInternalTriangleInfoMap).m_hashTable.m_capacity < iVar3) {
      if (iVar3 == 0) {
        piVar9 = (int *)0x0;
      }
      else {
        piVar9 = (int *)cbtAlignedAllocInternal((long)iVar3 * 4,0x10);
      }
      lVar10 = (long)(this->super_cbtInternalTriangleInfoMap).m_hashTable.m_size;
      if (0 < lVar10) {
        piVar5 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data;
        lVar14 = 0;
        do {
          piVar9[lVar14] = piVar5[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar10 != lVar14);
      }
      piVar5 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data;
      if (piVar5 != (int *)0x0) {
        if ((this->super_cbtInternalTriangleInfoMap).m_hashTable.m_ownsMemory == true) {
          cbtAlignedFreeInternal(piVar5);
        }
        (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data = (int *)0x0;
      }
      (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_ownsMemory = true;
      (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data = piVar9;
      (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_capacity = iVar3;
    }
    if (iVar4 < iVar3) {
      memset((this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data + iVar4,0,
             ((long)iVar3 - (long)iVar4) * 4);
    }
  }
  (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_size = iVar3;
  if (0 < tmapData->m_hashTableSize) {
    piVar9 = tmapData->m_hashTablePtr;
    piVar5 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data;
    lVar10 = 0;
    do {
      piVar5[lVar10] = piVar9[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 < tmapData->m_hashTableSize);
  }
  iVar3 = tmapData->m_nextSize;
  iVar4 = (this->super_cbtInternalTriangleInfoMap).m_next.m_size;
  if ((iVar4 <= iVar3) && (iVar4 < iVar3)) {
    if ((this->super_cbtInternalTriangleInfoMap).m_next.m_capacity < iVar3) {
      if (iVar3 == 0) {
        piVar9 = (int *)0x0;
      }
      else {
        piVar9 = (int *)cbtAlignedAllocInternal((long)iVar3 * 4,0x10);
      }
      lVar10 = (long)(this->super_cbtInternalTriangleInfoMap).m_next.m_size;
      if (0 < lVar10) {
        piVar5 = (this->super_cbtInternalTriangleInfoMap).m_next.m_data;
        lVar14 = 0;
        do {
          piVar9[lVar14] = piVar5[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar10 != lVar14);
      }
      piVar5 = (this->super_cbtInternalTriangleInfoMap).m_next.m_data;
      if (piVar5 != (int *)0x0) {
        if ((this->super_cbtInternalTriangleInfoMap).m_next.m_ownsMemory == true) {
          cbtAlignedFreeInternal(piVar5);
        }
        (this->super_cbtInternalTriangleInfoMap).m_next.m_data = (int *)0x0;
      }
      (this->super_cbtInternalTriangleInfoMap).m_next.m_ownsMemory = true;
      (this->super_cbtInternalTriangleInfoMap).m_next.m_data = piVar9;
      (this->super_cbtInternalTriangleInfoMap).m_next.m_capacity = iVar3;
    }
    if (iVar4 < iVar3) {
      memset((this->super_cbtInternalTriangleInfoMap).m_next.m_data + iVar4,0,
             ((long)iVar3 - (long)iVar4) * 4);
    }
  }
  (this->super_cbtInternalTriangleInfoMap).m_next.m_size = iVar3;
  if (0 < tmapData->m_nextSize) {
    piVar9 = tmapData->m_nextPtr;
    piVar5 = (this->super_cbtInternalTriangleInfoMap).m_next.m_data;
    lVar10 = 0;
    do {
      piVar5[lVar10] = piVar9[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 < tmapData->m_nextSize);
  }
  iVar3 = tmapData->m_numValues;
  iVar4 = (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_size;
  if ((iVar4 <= iVar3) && (iVar4 < iVar3)) {
    if ((this->super_cbtInternalTriangleInfoMap).m_valueArray.m_capacity < iVar3) {
      if (iVar3 == 0) {
        pcVar11 = (cbtTriangleInfo *)0x0;
      }
      else {
        pcVar11 = (cbtTriangleInfo *)cbtAlignedAllocInternal((long)iVar3 << 4,0x10);
      }
      lVar10 = (long)(this->super_cbtInternalTriangleInfoMap).m_valueArray.m_size;
      if (0 < lVar10) {
        lVar14 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&((this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data)->m_flags +
                   lVar14);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pcVar11->m_flags + lVar14);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          lVar14 = lVar14 + 0x10;
        } while (lVar10 * 0x10 != lVar14);
      }
      ptr = (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data;
      if (ptr != (cbtTriangleInfo *)0x0) {
        if ((this->super_cbtInternalTriangleInfoMap).m_valueArray.m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data = (cbtTriangleInfo *)0x0;
      }
      (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_ownsMemory = true;
      (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data = pcVar11;
      (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_capacity = iVar3;
    }
    if (iVar4 < iVar3) {
      lVar10 = (long)iVar3 - (long)iVar4;
      pcVar12 = &(this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data[iVar4].m_edgeV2V0Angle
      ;
      do {
        ((cbtTriangleInfo *)(pcVar12 + -3))->m_flags = 0;
        *(undefined8 *)(pcVar12 + -2) = 0x40c90fdb40c90fdb;
        *pcVar12 = 6.2831855;
        pcVar12 = pcVar12 + 4;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
  }
  (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_size = iVar3;
  iVar3 = tmapData->m_numValues;
  if (0 < (long)iVar3) {
    pcVar6 = tmapData->m_valueArrayPtr;
    pcVar11 = (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data;
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&pcVar11->m_edgeV0V1Angle + lVar10) =
           *(undefined4 *)((long)&pcVar6->m_edgeV0V1Angle + lVar10);
      *(undefined4 *)((long)&pcVar11->m_edgeV1V2Angle + lVar10) =
           *(undefined4 *)((long)&pcVar6->m_edgeV1V2Angle + lVar10);
      *(undefined4 *)((long)&pcVar11->m_edgeV2V0Angle + lVar10) =
           *(undefined4 *)((long)&pcVar6->m_edgeV2V0Angle + lVar10);
      *(undefined4 *)((long)&pcVar11->m_flags + lVar10) =
           *(undefined4 *)((long)&pcVar6->m_flags + lVar10);
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar10);
  }
  iVar3 = tmapData->m_numKeys;
  iVar4 = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_size;
  if ((iVar4 <= iVar3) && (iVar4 < iVar3)) {
    if ((this->super_cbtInternalTriangleInfoMap).m_keyArray.m_capacity < iVar3) {
      if (iVar3 == 0) {
        pcVar13 = (cbtHashInt *)0x0;
      }
      else {
        pcVar13 = (cbtHashInt *)cbtAlignedAllocInternal((long)iVar3 * 4,0x10);
      }
      lVar10 = (long)(this->super_cbtInternalTriangleInfoMap).m_keyArray.m_size;
      if (0 < lVar10) {
        pcVar7 = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data;
        lVar14 = 0;
        do {
          pcVar13[lVar14].m_uid = pcVar7[lVar14].m_uid;
          lVar14 = lVar14 + 1;
        } while (lVar10 != lVar14);
      }
      pcVar7 = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data;
      if (pcVar7 != (cbtHashInt *)0x0) {
        if ((this->super_cbtInternalTriangleInfoMap).m_keyArray.m_ownsMemory == true) {
          cbtAlignedFreeInternal(pcVar7);
        }
        (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data = (cbtHashInt *)0x0;
      }
      (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_ownsMemory = true;
      (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data = pcVar13;
      (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_capacity = iVar3;
    }
    if (iVar4 < iVar3) {
      memset((this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data + iVar4,0,
             ((long)iVar3 - (long)iVar4) * 4);
    }
  }
  (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_size = iVar3;
  iVar3 = tmapData->m_numKeys;
  if (0 < (long)iVar3) {
    pcVar13 = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data;
    piVar9 = tmapData->m_keyArrayPtr;
    lVar10 = 0;
    do {
      pcVar13[lVar10].m_uid = piVar9[lVar10];
      lVar10 = lVar10 + 1;
    } while (iVar3 != lVar10);
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE void cbtTriangleInfoMap::deSerialize(cbtTriangleInfoMapData& tmapData)
{
	m_convexEpsilon = tmapData.m_convexEpsilon;
	m_planarEpsilon = tmapData.m_planarEpsilon;
	m_equalVertexThreshold = tmapData.m_equalVertexThreshold;
	m_edgeDistanceThreshold = tmapData.m_edgeDistanceThreshold;
	m_zeroAreaThreshold = tmapData.m_zeroAreaThreshold;
	m_hashTable.resize(tmapData.m_hashTableSize);
	int i = 0;
	for (i = 0; i < tmapData.m_hashTableSize; i++)
	{
		m_hashTable[i] = tmapData.m_hashTablePtr[i];
	}
	m_next.resize(tmapData.m_nextSize);
	for (i = 0; i < tmapData.m_nextSize; i++)
	{
		m_next[i] = tmapData.m_nextPtr[i];
	}
	m_valueArray.resize(tmapData.m_numValues);
	for (i = 0; i < tmapData.m_numValues; i++)
	{
		m_valueArray[i].m_edgeV0V1Angle = tmapData.m_valueArrayPtr[i].m_edgeV0V1Angle;
		m_valueArray[i].m_edgeV1V2Angle = tmapData.m_valueArrayPtr[i].m_edgeV1V2Angle;
		m_valueArray[i].m_edgeV2V0Angle = tmapData.m_valueArrayPtr[i].m_edgeV2V0Angle;
		m_valueArray[i].m_flags = tmapData.m_valueArrayPtr[i].m_flags;
	}

	m_keyArray.resize(tmapData.m_numKeys, cbtHashInt(0));
	for (i = 0; i < tmapData.m_numKeys; i++)
	{
		m_keyArray[i].setUid1(tmapData.m_keyArrayPtr[i]);
	}
}